

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remote_server.cpp
# Opt level: O3

void GetRequestHandler(CManager cm,CMConnection conn,void *vevent,void *client_data,attr_list attrs)

{
  AnonADIOSFile *f;
  mapped_type *ppAVar1;
  ulong uVar2;
  GetRequestMsg GetMsg;
  DataType TypeOfVar;
  string VarName;
  GetRequestMsg local_60;
  undefined4 local_54;
  string local_50;
  
  local_50._M_dataplus._M_p = *(pointer *)((long)vevent + 8);
  local_60 = (GetRequestMsg)vevent;
  ppAVar1 = std::__detail::
            _Map_base<unsigned_long,_std::pair<const_unsigned_long,_AnonADIOSFile_*>,_std::allocator<std::pair<const_unsigned_long,_AnonADIOSFile_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_AnonADIOSFile_*>,_std::allocator<std::pair<const_unsigned_long,_AnonADIOSFile_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&ADIOSFileMap,(key_type *)&local_50);
  f = *ppAVar1;
  last_service_time.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  if (f->m_mode == RemoteOpen) {
    if (f->currentStep == -1) {
      adios2::core::Engine::BeginStep();
      f->currentStep = f->currentStep + 1;
    }
    uVar2 = (**(code **)(*(long *)f->m_engine + 0x20))();
    vevent = local_60;
    if (uVar2 < local_60->Step) {
      do {
        if (1 < verbose) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Advancing a step",0x10);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
          std::ostream::put(-0x18);
          std::ostream::flush();
        }
        (**(code **)(*(long *)f->m_engine + 0x28))();
        adios2::core::Engine::BeginStep();
        f->currentStep = f->currentStep + 1;
        uVar2 = (**(code **)(*(long *)f->m_engine + 0x20))();
        vevent = local_60;
      } while (uVar2 < local_60->Step);
    }
  }
  std::__cxx11::string::string
            ((string *)&local_50,((GetRequestMsg)vevent)->VarName,(allocator *)&local_54);
  local_54 = adios2::core::IO::InquireVariableType((string *)f->m_io);
  switch(local_54) {
  case 1:
    PrepareResponseForGet<signed_char>
              (conn,(Remote_evpath_state *)client_data,&local_60,&local_50,Int8,f);
    break;
  case 2:
    PrepareResponseForGet<short>
              (conn,(Remote_evpath_state *)client_data,&local_60,&local_50,Int16,f);
    break;
  case 3:
    PrepareResponseForGet<int>(conn,(Remote_evpath_state *)client_data,&local_60,&local_50,Int32,f);
    break;
  case 4:
    PrepareResponseForGet<long>(conn,(Remote_evpath_state *)client_data,&local_60,&local_50,Int64,f)
    ;
    break;
  case 5:
    PrepareResponseForGet<unsigned_char>
              (conn,(Remote_evpath_state *)client_data,&local_60,&local_50,UInt8,f);
    break;
  case 6:
    PrepareResponseForGet<unsigned_short>
              (conn,(Remote_evpath_state *)client_data,&local_60,&local_50,UInt16,f);
    break;
  case 7:
    PrepareResponseForGet<unsigned_int>
              (conn,(Remote_evpath_state *)client_data,&local_60,&local_50,UInt32,f);
    break;
  case 8:
    PrepareResponseForGet<unsigned_long>
              (conn,(Remote_evpath_state *)client_data,&local_60,&local_50,UInt64,f);
    break;
  case 9:
    PrepareResponseForGet<float>
              (conn,(Remote_evpath_state *)client_data,&local_60,&local_50,Float,f);
    break;
  case 10:
    PrepareResponseForGet<double>
              (conn,(Remote_evpath_state *)client_data,&local_60,&local_50,Double,f);
    break;
  case 0xb:
    PrepareResponseForGet<long_double>
              (conn,(Remote_evpath_state *)client_data,&local_60,&local_50,LongDouble,f);
    break;
  case 0xc:
    PrepareResponseForGet<std::complex<float>>
              (conn,(Remote_evpath_state *)client_data,&local_60,&local_50,FloatComplex,f);
    break;
  case 0xd:
    PrepareResponseForGet<std::complex<double>>
              (conn,(Remote_evpath_state *)client_data,&local_60,&local_50,DoubleComplex,f);
    break;
  case 0xf:
    PrepareResponseForGet<char>(conn,(Remote_evpath_state *)client_data,&local_60,&local_50,Char,f);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return;
}

Assistant:

static void GetRequestHandler(CManager cm, CMConnection conn, void *vevent, void *client_data,
                              attr_list attrs)
{
    GetRequestMsg GetMsg = static_cast<GetRequestMsg>(vevent);
    AnonADIOSFile *f = ADIOSFileMap[GetMsg->FileHandle];
    struct Remote_evpath_state *ev_state = static_cast<struct Remote_evpath_state *>(client_data);
    last_service_time = std::chrono::steady_clock::now();
    if (f->m_mode == RemoteOpen)
    {
        if (f->currentStep == -1)
        {
            f->m_engine->BeginStep();
            f->currentStep++;
        }
        while (f->m_engine->CurrentStep() < GetMsg->Step)
        {
            if (verbose >= 2)
                std::cout << "Advancing a step" << std::endl;
            f->m_engine->EndStep();
            f->m_engine->BeginStep();
            f->currentStep++;
        }
    }

    std::string VarName = std::string(GetMsg->VarName);
    adios2::DataType TypeOfVar = f->m_io->InquireVariableType(VarName);

    try
    {
        if (TypeOfVar == adios2::DataType::None)
        {
        }
#define GET(T)                                                                                     \
    else if (TypeOfVar == helper::GetDataType<T>())                                                \
    {                                                                                              \
        PrepareResponseForGet<T>(conn, ev_state, std::ref(GetMsg), std::ref(VarName), TypeOfVar,   \
                                 f);                                                               \
    }
        ADIOS2_FOREACH_PRIMITIVE_STDTYPE_1ARG(GET)
#undef GET
    }
    catch (const std::exception &exc)
    {
        if (verbose)
            std::cout << "Returning exception " << exc.what() << " for Get<" << TypeOfVar << ">("
                      << VarName << ")" << std::endl;
    }
}